

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Buffer::Free(Buffer *this,int BlockNum)

{
  iterator __position;
  int pos;
  int local_14;
  
  __position = Find(this,BlockNum);
  if (__position._M_node != (_List_node_base *)&this->Occupy_Block) {
    local_14 = *(int *)&__position._M_node[1]._M_next;
    std::__cxx11::list<int,_std::allocator<int>_>::erase
              (&this->Occupy_Block,(const_iterator)__position._M_node);
    std::__cxx11::list<int,_std::allocator<int>_>::push_back(&this->Empty_Block,&local_14);
    Block::BlockClear_Back(this->buffer + local_14);
    this->Dirty[local_14] = 0;
    this->Pin[local_14] = 0;
  }
  return;
}

Assistant:

void Buffer::Free(int BlockNum) {
	int pos;
	list<int>::iterator it;
	it = this->Find(BlockNum);
	if (it != this->Occupy_Block.end()) {			//B�ڱ�ռ��������
		pos = *it;
		it = this->Occupy_Block.erase(it);			//��ռ�ÿ�������ɾȥ
		this->Empty_Block.push_back(pos);			//��ӽ��տ�������
		this->buffer[pos].BlockClear_Back();
		this->UnDirt(pos);
		this->UnLock(pos);
	}
}